

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::parseTableCreation(Parser *this)

{
  uint uVar1;
  Parser *this_00;
  reference ppNVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  sockaddr *__addr_06;
  sockaddr *extraout_RDX_00;
  Parser *in_RDI;
  Node *value;
  Node *key;
  vector<Token_*,_std::allocator<Token_*>_> assignmentTokens;
  vector<Node_*,_std::allocator<Node_*>_> values;
  vector<Node_*,_std::allocator<Node_*>_> keys;
  Token *opToken;
  ExprContextScope exprContextScope;
  Parser *in_stack_000000e8;
  vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
  *in_stack_ffffffffffffff18;
  ExprContextScope *in_stack_ffffffffffffff20;
  Node *in_stack_ffffffffffffff28;
  Node *in_stack_ffffffffffffff30;
  Parser *in_stack_ffffffffffffff38;
  Parser *in_stack_ffffffffffffff40;
  Parser *in_stack_ffffffffffffff48;
  Node *local_88;
  Parser *local_80;
  vector<Token_*,_std::allocator<Token_*>_> *in_stack_ffffffffffffff90;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_ffffffffffffff98;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_ffffffffffffffa0;
  Token *in_stack_ffffffffffffffa8;
  Parser *in_stack_ffffffffffffffb0;
  Parser *pPVar3;
  Parser *in_stack_fffffffffffffff8;
  Node *pNVar4;
  
  pPVar3 = in_RDI;
  parseTableCreation()::ExprContextScope::ExprContextScope(std::vector<Parser::ExpressionContext,std
  ::allocator<Parser::ExpressionContext>_>__(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x124c4b);
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)0x124c58);
  std::vector<Token_*,_std::allocator<Token_*>_>::vector
            ((vector<Token_*,_std::allocator<Token_*>_> *)0x124c65);
  uVar1 = accept(in_RDI,0x18,__addr,in_RCX);
  __addr_00 = extraout_RDX;
  if ((uVar1 & 1) == 0) {
    do {
      local_80 = (Parser *)0x0;
      local_88 = (Node *)0x0;
      uVar1 = accept(in_RDI,2,__addr_00,in_RCX);
      if ((uVar1 & 1) == 0) {
        uVar1 = accept(in_RDI,0x19,__addr_01,in_RCX);
        if ((uVar1 & 1) == 0) {
          uVar1 = accept(in_RDI,3,__addr_03,in_RCX);
          if ((uVar1 & 1) == 0) {
            uVar1 = accept(in_RDI,0x48,__addr_04,in_RCX);
            if (((uVar1 & 1) != 0) &&
               (local_88 = parseFunction((Parser *)
                                         values.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         values.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                         _M_impl.super__Vector_impl_data._M_finish._4_4_),
               in_stack_ffffffffffffff30 = local_88, local_88 != (Node *)0x0)) {
              ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                                  (&local_88->children,0);
              local_80 = (Parser *)*ppNVar2;
            }
          }
          else {
            local_80 = (Parser *)
                       createOperandNode(in_stack_ffffffffffffff48,
                                         (Token *)in_stack_ffffffffffffff40);
            in_stack_ffffffffffffff38 = local_80;
            expect(in_stack_fffffffffffffff8,(TokenType)((ulong)pPVar3 >> 0x20));
          }
        }
        else {
          in_stack_ffffffffffffff48 = (Parser *)in_RDI->tok;
          this_00 = (Parser *)parseTernaryOp(in_stack_000000e8);
          local_80 = (Parser *)
                     createMakeKeyNode(this_00,(Token *)in_stack_ffffffffffffff48,
                                       (Node *)in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff40 = local_80;
          expect(in_stack_fffffffffffffff8,(TokenType)((ulong)pPVar3 >> 0x20));
          expect(in_stack_fffffffffffffff8,(TokenType)((ulong)pPVar3 >> 0x20));
        }
      }
      else {
        local_80 = (Parser *)
                   createIdentifierNode
                             (in_stack_ffffffffffffff40,(Token *)in_stack_ffffffffffffff38);
        uVar1 = accept(in_RDI,6,__addr_02,in_RCX);
        if ((uVar1 & 1) == 0) {
          local_88 = createIdentifierNode
                               (in_stack_ffffffffffffff40,(Token *)in_stack_ffffffffffffff38);
        }
      }
      if ((local_80 == (Parser *)0x0) || ((in_RDI->ctx->isError & 1U) != 0)) {
LAB_00124fab:
        pNVar4 = (Node *)0x0;
        goto LAB_00124fbf;
      }
      std::vector<Token_*,_std::allocator<Token_*>_>::push_back
                ((vector<Token_*,_std::allocator<Token_*>_> *)in_stack_ffffffffffffff30,
                 (value_type *)in_stack_ffffffffffffff28);
      if (local_88 == (Node *)0x0) {
        in_stack_ffffffffffffff28 = parseTernaryOp(in_stack_000000e8);
        local_88 = in_stack_ffffffffffffff28;
      }
      if (local_88 == (Node *)0x0) goto LAB_00124fab;
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffff30,
                 (value_type *)in_stack_ffffffffffffff28);
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffff30,
                 (value_type *)in_stack_ffffffffffffff28);
      accept(in_RDI,8,__addr_05,in_RCX);
      uVar1 = accept(in_RDI,0x18,__addr_06,in_RCX);
      __addr_00 = extraout_RDX_00;
    } while ((uVar1 & 1) == 0);
    pNVar4 = createTableCreationNode
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
  }
  else {
    pNVar4 = createTableCreationNode
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        in_stack_ffffffffffffff90);
  }
LAB_00124fbf:
  std::vector<Token_*,_std::allocator<Token_*>_>::~vector
            ((vector<Token_*,_std::allocator<Token_*>_> *)in_stack_ffffffffffffff30);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffff30);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)in_stack_ffffffffffffff30);
  parseTableCreation::ExprContextScope::~ExprContextScope((ExprContextScope *)0x124ff3);
  return pNVar4;
}

Assistant:

Node * parseTableCreation()
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Token & opToken = *tok;
    std::vector<Node *> keys;
    std::vector<Node *> values;
    std::vector<Token *> assignmentTokens;

    if (accept(TK_RBRACE))
      return createTableCreationNode(opToken, keys, values, assignmentTokens);

    for (;;)
    {
      Node * key = nullptr;
      Node * value = nullptr;

      if (accept(TK_IDENTIFIER))
      {
        key = createIdentifierNode(*tok);
        if (!accept(TK_ASSIGN))
          value = createIdentifierNode(*tok);
      }
      else if (accept(TK_LSQUARE))
      {
        key = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
      }
      else if (accept(TK_STRING_LITERAL))
      {
        key = createOperandNode(*tok);
        expect(TK_COLON);
      }
      else if (accept(TK_FUNCTION))
      {
        value = parseFunction(FT_FUNCTION);
        if (value)
          key = value->children[0]; // function name
      }

      if (!key || ctx.isError)
        break;

      assignmentTokens.push_back(tok);

      if (!value)
        value = parseTernaryOp();
      if (!value)
        break;

      keys.push_back(key);
      values.push_back(value);
      accept(TK_COMMA); // optional comma
      if (accept(TK_RBRACE))
        return createTableCreationNode(opToken, keys, values, assignmentTokens);
    }

    return nullptr;
  }